

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O0

string * SimpleLogger::replaceString(string *src_str,string *before,string *after)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  string *in_RCX;
  ulong in_RDX;
  string *in_RSI;
  string *in_RDI;
  size_t pos;
  size_t last;
  string *ret;
  string local_88 [48];
  string local_58 [39];
  undefined1 local_31;
  long local_30;
  ulong local_28;
  string *local_20;
  ulong local_18;
  string *local_10;
  
  local_28 = 0;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_30 = std::__cxx11::string::find(in_RSI,in_RDX);
  local_31 = 0;
  std::__cxx11::string::string(in_RDI);
  while (uVar2 = local_28, local_30 != -1) {
    std::__cxx11::string::substr((ulong)local_58,(ulong)local_10);
    std::__cxx11::string::operator+=(in_RDI,local_58);
    std::__cxx11::string::~string(local_58);
    std::__cxx11::string::operator+=(in_RDI,local_20);
    lVar1 = local_30;
    lVar3 = std::__cxx11::string::size();
    local_28 = lVar1 + lVar3;
    local_30 = std::__cxx11::string::find(local_10,local_18);
  }
  uVar4 = std::__cxx11::string::size();
  if (uVar2 < uVar4) {
    std::__cxx11::string::substr((ulong)local_88,(ulong)local_10);
    std::__cxx11::string::operator+=(in_RDI,local_88);
    std::__cxx11::string::~string(local_88);
  }
  return in_RDI;
}

Assistant:

std::string SimpleLogger::replaceString( const std::string& src_str,
                                         const std::string& before,
                                         const std::string& after )
{
    size_t last = 0;
    size_t pos = src_str.find(before, last);
    std::string ret;
    while (pos != std::string::npos) {
        ret += src_str.substr(last, pos - last);
        ret += after;
        last = pos + before.size();
        pos = src_str.find(before, last);
    }
    if (last < src_str.size()) {
        ret += src_str.substr(last);
    }
    return ret;
}